

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellLinkAndJumpListHandler.cpp
# Opt level: O1

void __thiscall ShellLinkAndJumpListHandler::parseFile(ShellLinkAndJumpListHandler *this)

{
  pointer puVar1;
  undefined1 uVar2;
  undefined1 *puVar3;
  long lVar4;
  undefined1 *__src;
  undefined1 *puVar5;
  long lVar6;
  bool bVar7;
  uint uVar8;
  undefined1 *puVar9;
  ostream *poVar10;
  long *plVar11;
  undefined1 *puVar12;
  ptrdiff_t _Num;
  ulong __n;
  long local_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  ShellLinkAndJumpListHandler *local_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_90 = 0;
  bVar7 = false;
  puVar9 = (undefined1 *)0x0;
  local_50 = this;
  do {
    lVar4 = local_90;
    ReadStream::read((ReadStream *)&local_48,(int)this->rs,(void *)(ulong)(uint)this->startPosition,
                     4);
    lVar6 = local_38;
    puVar5 = puStack_40;
    __src = local_48;
    local_90 = local_38;
    local_48 = (undefined1 *)0x0;
    puStack_40 = (undefined1 *)0x0;
    local_38 = 0;
    if (puVar9 != (undefined1 *)0x0) {
      operator_delete(puVar9,lVar4 - (long)puVar9);
    }
    if (local_48 != (undefined1 *)0x0) {
      operator_delete(local_48,local_38 - (long)local_48);
    }
    puVar9 = puVar5 + -1;
    puVar3 = __src;
    if (__src < puVar9 && __src != puVar5) {
      do {
        puVar12 = puVar3 + 1;
        uVar2 = *puVar3;
        *puVar3 = *puVar9;
        *puVar9 = uVar2;
        puVar9 = puVar9 + -1;
        puVar3 = puVar12;
      } while (puVar12 < puVar9);
    }
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __n = (long)puVar5 - (long)__src;
    if (__n == 0) {
      local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
    }
    else {
      if ((long)__n < 0) goto LAB_001310c2;
      local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)operator_new(__n);
    }
    puVar1 = local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + __n;
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar1;
    if (puVar5 != __src) {
      local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      memmove(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start,__src,__n);
    }
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
    uVar8 = Utils::lenFourBytesChar(&local_68);
    this = local_50;
    if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (uVar8 == 0x4c) {
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (puVar5 == __src) {
        local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
      }
      else {
        if ((long)__n < 0) {
LAB_001310c2:
          std::__throw_bad_alloc();
        }
        local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)operator_new(__n);
      }
      puVar1 = local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + __n;
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar1;
      if (puVar5 != __src) {
        local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        memmove(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start,__src,__n);
      }
      this = local_50;
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
      parseLNKStruct(local_50,&local_88);
      if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    if (((bVar7 == false) && (uVar8 < 5)) && ((0x1aU >> (uVar8 & 0x1f) & 1) != 0)) {
      bVar7 = parseJumpListStruct(this);
    }
    this->startPosition = this->startPosition + 4;
    puVar9 = __src;
    if (puVar5 == __src) {
      if (bVar7 == false) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"DestList structure not found.",0x1d);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
        std::ostream::put('(');
        poVar10 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,"This may be because not all LNK structures are found, ",0x36);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        poVar10 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,"or because the DestList is not located after the LNK stream, ",0x3d);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,"or because file doesn\'t contain DestList at all.",0x30);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        plVar11 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
        std::ostream::put((char)plVar11);
        plVar11 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
        std::ostream::put((char)plVar11);
        std::ostream::flush();
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"The total number of Shell Link = ",0x21);
      *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
      plVar11 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->countOfShellLink);
      std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
      std::ostream::put((char)plVar11);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"The number of Shell Link with errors while parsing = ",0x35)
      ;
      *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
      plVar11 = (long *)std::ostream::operator<<
                                  ((ostream *)&std::cout,this->countOfShellLinkWithErrors);
      std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
      std::ostream::put((char)plVar11);
      std::ostream::flush();
      if (__src != (undefined1 *)0x0) {
        operator_delete(__src,lVar6 - (long)__src);
      }
      return;
    }
  } while( true );
}

Assistant:

void ShellLinkAndJumpListHandler::parseFile() {
    bool isDestListStructFound = false;
    std::vector<unsigned char> headerValue;
    do {
        headerValue =  rs->read(startPosition,4);

        reverse(headerValue.begin(), headerValue.end());
        unsigned int hValue = Utils::lenFourBytesChar(headerValue);

        if(hValue == 0x0000004c) { /* Decode ShellLink Stream = CustDest Jump List */
            ShellLinkAndJumpListHandler::parseLNKStruct(headerValue);
        }
        /* 0x00000004 - Windows 10
         * 0x00000003 - Windows 10
         * 0x00000001 - Windows 7
         * 0x00000001 - Windows 8 */
        if(!isDestListStructFound && (hValue == 0x00000001 || hValue == 0x00000003 || hValue == 0x00000004))
            isDestListStructFound = ShellLinkAndJumpListHandler::parseJumpListStruct();

        startPosition += 4;
    } while(headerValue.size() != 0);

    if(!isDestListStructFound)
        cout << "DestList structure not found." << endl
        << "This may be because not all LNK structures are found, " << endl <<
           "or because the DestList is not located after the LNK stream, " <<
           "or because file doesn't contain DestList at all." << endl << endl << endl;
    cout << "The total number of Shell Link = " << dec << countOfShellLink << endl;
    cout << "The number of Shell Link with errors while parsing = " << dec << countOfShellLinkWithErrors << endl;
}